

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall minja::IfTemplateToken::~IfTemplateToken(IfTemplateToken *this)

{
  (this->super_TemplateToken)._vptr_TemplateToken = (_func_int **)&PTR__IfTemplateToken_0022c088;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->condition).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  TemplateToken::~TemplateToken(&this->super_TemplateToken);
  return;
}

Assistant:

IfTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, std::shared_ptr<Expression> && c) : TemplateToken(Type::If, loc, pre, post), condition(std::move(c)) {}